

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool __thiscall cmState::GetGlobalPropertyAsBool(cmState *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  cmState *this_local;
  
  val = GetGlobalProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmState::GetGlobalPropertyAsBool(const std::string& prop)
{
  return cmIsOn(this->GetGlobalProperty(prop));
}